

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzprinteg.h
# Opt level: O2

void __thiscall
TPZPrInteg<TPZIntTriang>::Point(TPZPrInteg<TPZIntTriang> *this,int ip,TPZVec<double> *pos,REAL *w)

{
  int iVar1;
  ulong uVar2;
  int i;
  int i_00;
  longdouble in_ST0;
  longdouble in_ST1;
  
  iVar1 = this->fIntP->fNumInt;
  uVar2 = (long)ip % (long)iVar1;
  TPZIntTriang::Point(&this->super_TPZIntTriang,ip / iVar1,pos,w);
  TPZGaussRule::Loc((longdouble *)this->fIntP,(TPZGaussRule *)(uVar2 & 0xffffffff),i);
  pos->fStore[2] = (double)in_ST0;
  TPZGaussRule::W((longdouble *)this->fIntP,(TPZGaussRule *)(uVar2 & 0xffffffff),i_00);
  *w = (double)(in_ST1 * (longdouble)*w);
  return;
}

Assistant:

void Point(int ip, TPZVec<REAL> &pos, REAL &w) const override
    {
		int ipf = ip/fIntP->NInt();
		int iploc = ip%(fIntP->NInt());
		TFather::Point(ipf,pos,w);
		pos[Dim-1] = fIntP->Loc(iploc);
		w *= fIntP->W(iploc);
    }